

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

Byte ppmd_read(void *p)

{
  long *plVar1;
  archive_read *a;
  void *pvVar2;
  Byte BVar3;
  Byte *pBVar4;
  ssize_t bytes_avail;
  ssize_t local_28;
  
  a = *p;
  pvVar2 = a->format->data;
  local_28 = 0;
  pBVar4 = (Byte *)__archive_read_ahead(a,1,&local_28);
  if (local_28 < 1) {
    *(undefined1 *)((long)pvVar2 + 0x1ec9) = 1;
    BVar3 = '\0';
  }
  else {
    __archive_read_consume(a,1);
    plVar1 = (long *)((long)pvVar2 + 0x1e0);
    *plVar1 = *plVar1 + 1;
    BVar3 = *pBVar4;
  }
  return BVar3;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in <= 0) {
		/*
		 * Ppmd7_DecodeSymbol might require reading multiple bytes
		 * and we are on boundary;
		 * last resort to read using __archive_read_ahead.
		 */
		ssize_t bytes_avail = 0;
		const uint8_t* data = __archive_read_ahead(a,
		    (size_t)zip->ppstream.stream_in+1, &bytes_avail);
		if(data == NULL || bytes_avail < zip->ppstream.stream_in+1) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7z file data");
			zip->ppstream.overconsumed = 1;
			return (0);
		}
		zip->ppstream.next_in++;
		b = data[zip->ppstream.stream_in];
	} else {
		b = *zip->ppstream.next_in++;
	}
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	zip->ppstream.stream_in++;
	return (b);
}